

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svg.cpp
# Opt level: O0

void __thiscall CGL::Triangle::draw(Triangle *this,DrawRend *dr,Matrix3x3 *global_transform)

{
  Color color;
  Color local_a4;
  double local_98;
  Vector2D p2_scr;
  Vector2D p1_scr;
  Vector2D p0_scr;
  double dStack_60;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  double local_38;
  double dStack_30;
  double local_28;
  Matrix3x3 *global_transform_local;
  DrawRend *dr_local;
  Triangle *this_local;
  
  Matrix3x3::operator*((Matrix3x3 *)&p0_scr.y,global_transform,&(this->super_SVGElement).transform);
  global_transform->entries[2].z = local_28;
  global_transform->entries[2].x = local_38;
  global_transform->entries[2].y = dStack_30;
  global_transform->entries[1].y = local_48;
  global_transform->entries[1].z = dStack_40;
  global_transform->entries[0].z = local_58;
  global_transform->entries[1].x = dStack_50;
  global_transform->entries[0].x = p0_scr.y;
  global_transform->entries[0].y = dStack_60;
  CGL::operator*((CGL *)&p1_scr.y,global_transform,&this->p0_svg);
  CGL::operator*((CGL *)&p2_scr.y,global_transform,&this->p1_svg);
  CGL::operator*((CGL *)&local_98,global_transform,&this->p2_svg);
  Color::Color(&local_a4,0.0,0.0,0.0);
  color.b = local_a4.b;
  color.r = local_a4.r;
  color.g = local_a4.g;
  DrawRend::rasterize_triangle
            (dr,(float)p1_scr.y,(float)p0_scr.x,(float)p2_scr.y,(float)p1_scr.x,(float)local_98,
             (float)p2_scr.x,color,this);
  return;
}

Assistant:

void Triangle::draw(DrawRend *dr, Matrix3x3 global_transform) {
  global_transform = global_transform * transform;

  Vector2D p0_scr = global_transform * p0_svg;
  Vector2D p1_scr = global_transform * p1_svg;
  Vector2D p2_scr = global_transform * p2_svg;

  // draw fill. Here the color field is empty, since children
  // export their own more sophisticated color() method.
  dr->rasterize_triangle( p0_scr.x, p0_scr.y, p1_scr.x, p1_scr.y, p2_scr.x, p2_scr.y, Color(), this );

}